

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl> *this,
          void *pointer)

{
  long lVar1;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> local_30;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x10);
    Mutex::lock((Mutex *)(lVar1 + 0x18),EXCLUSIVE);
    local_30.ptr = (Impl *)(lVar1 + 0x30);
    *(int *)(lVar1 + 0x60) = *(int *)(lVar1 + 0x60) + -1;
    local_30.mutex = (Mutex *)(lVar1 + 0x18);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&local_30);
    Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own
              ((Own<const_kj::(anonymous_namespace)::InMemoryFile> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }